

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O3

void __thiscall asmjit::v1_14::JitAllocator::reset(JitAllocator *this,ResetPolicy resetPolicy)

{
  ulong *puVar1;
  JitAllocatorPrivateImpl *impl;
  size_t sVar2;
  JitAllocatorPool *pJVar3;
  JitAllocatorBlock *pJVar4;
  JitAllocatorPool *pJVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  JitAllocatorBlock *pJVar12;
  size_t byteSize;
  ulong uVar13;
  undefined4 in_register_00000034;
  JitAllocatorBlock *block;
  JitAllocatorBlock *impl_00;
  void *mem;
  size_t sVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong uVar18;
  
  block = (JitAllocatorBlock *)CONCAT44(in_register_00000034,resetPolicy);
  impl = (JitAllocatorPrivateImpl *)this->_impl;
  if (impl != (JitAllocatorPrivateImpl *)JitAllocatorImpl_none) {
    *(undefined8 *)&impl->tree = 0;
    sVar2 = impl->poolCount;
    if (sVar2 != 0) {
      sVar14 = 0;
      do {
        pJVar3 = impl->pools;
        pJVar4 = *(JitAllocatorBlock **)(pJVar3 + sVar14);
        *(undefined8 *)&pJVar3[sVar14].field_0xc = 0;
        *(undefined8 *)(&pJVar3[sVar14].field_0xc + 8) = 0;
        *(undefined8 *)(pJVar3 + sVar14) = 0;
        *(undefined8 *)&pJVar3[sVar14].field_0x8 = 0;
        pJVar3[sVar14].totalAreaSize[0] = 0;
        pJVar3[sVar14].totalAreaSize[1] = 0;
        pJVar3[sVar14].totalAreaUsed[0] = 0;
        pJVar3[sVar14].totalAreaUsed[1] = 0;
        pJVar3[sVar14].totalOverheadBytes = 0;
        if (pJVar4 != (JitAllocatorBlock *)0x0) {
          if ((resetPolicy == kHard) || (((impl->super_Impl).options & kImmediateRelease) != kNone))
          {
            pJVar12 = (JitAllocatorBlock *)0x0;
            impl_00 = pJVar4;
LAB_0011fe51:
            do {
              pJVar4 = *(JitAllocatorBlock **)&impl_00->field_0x18;
              JitAllocatorImpl_deleteBlock((JitAllocatorPrivateImpl *)impl_00,block);
              impl_00 = pJVar4;
            } while (pJVar4 != (JitAllocatorBlock *)0x0);
            pJVar4 = pJVar12;
            if (pJVar12 == (JitAllocatorBlock *)0x0) goto LAB_001200c7;
          }
          else {
            impl_00 = *(JitAllocatorBlock **)&pJVar4->field_0x18;
            pJVar12 = pJVar4;
            if (*(JitAllocatorBlock **)&pJVar4->field_0x18 != (JitAllocatorBlock *)0x0)
            goto LAB_0011fe51;
          }
          block = pJVar4;
          *(undefined8 *)&block->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock> = 0;
          *(undefined8 *)&block->field_0x18 = 0;
          uVar10 = block->_flags;
          if ((uVar10 & 2) == 0) {
            if (((impl->super_Impl).options & kFillUnusedMemory) != kNone) {
              pJVar5 = block->_pool;
              VirtMem::protectJitMemory(kReadWrite);
              puVar16 = block->_usedBitVector;
              uVar13 = (ulong)block->_areaSize + 0x3f & 0x1ffffffc0;
              if (uVar13 == 0) {
                uVar17 = 0;
              }
              else {
                uVar17 = ~*puVar16;
              }
              uVar9 = (ulong)pJVar5->granularity;
              pvVar6 = (block->_mapping).rw;
              uVar15 = 0;
LAB_0011feed:
              uVar18 = uVar17;
              if (uVar17 == 0) {
                do {
                  uVar15 = uVar15 + 0x40;
                  if (uVar13 <= uVar15) {
                    VirtMem::protectJitMemory(kReadExecute);
                    uVar10 = block->_flags;
                    goto LAB_0012002c;
                  }
                  puVar1 = puVar16 + 1;
                  puVar16 = puVar16 + 1;
                } while (*puVar1 == 0xffffffffffffffff);
                uVar18 = ~*puVar1;
              }
              lVar7 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                }
              }
              uVar11 = -1L << ((byte)lVar7 & 0x3f);
              lVar7 = lVar7 + uVar15;
              uVar17 = uVar11 ^ uVar18;
              if (uVar11 == uVar18) {
                uVar11 = uVar15 + 0x40;
                uVar18 = uVar11;
                if (uVar13 < uVar11) {
                  uVar18 = uVar13;
                }
                if ((uVar18 - lVar7 != -1) && (uVar15 = uVar11, uVar11 < uVar13)) {
LAB_0011ff5a:
                  puVar16 = puVar16 + 1;
                  uVar17 = *puVar16;
                  if (uVar17 == 0) {
                    uVar15 = uVar11 + 0x40;
                    uVar18 = uVar15;
                    if (uVar13 < uVar15) {
                      uVar18 = uVar13;
                    }
                    if (uVar18 - lVar7 != -1) goto code_r0x0011ff7f;
                    uVar17 = 0;
                    uVar15 = uVar11;
                  }
                  else {
                    lVar8 = 0;
                    if (uVar17 != 0) {
                      for (; (uVar17 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                      }
                    }
                    uVar18 = lVar8 + uVar11;
                    if (uVar13 < lVar8 + uVar11) {
                      uVar18 = uVar13;
                    }
                    uVar17 = -1L << ((byte)lVar8 & 0x3f) ^ uVar17;
                    uVar15 = uVar11;
                  }
                }
              }
              else {
                lVar8 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                  }
                }
                uVar18 = lVar8 + uVar15;
                if (uVar13 < lVar8 + uVar15) {
                  uVar18 = uVar13;
                }
                uVar17 = uVar17 ^ -1L << ((byte)lVar8 & 0x3f);
              }
              goto LAB_0011ffd2;
            }
LAB_0012002c:
            uVar13 = (ulong)((uint)((ulong)block->_areaSize + 0x3f >> 3) & 0xfffffff8);
            memset(block->_usedBitVector,0,uVar13);
            memset(block->_stopBitVector,0,uVar13);
            puVar16 = block->_usedBitVector;
            if ((uVar10 & 1) == 0) {
              *puVar16 = *puVar16 & 0xfffffffffffffffe;
              *block->_stopBitVector = *block->_stopBitVector & 0xfffffffffffffffe;
            }
            else {
              *puVar16 = *puVar16 | 1;
              *block->_stopBitVector = *block->_stopBitVector | 1;
            }
            uVar10 = block->_flags & 1;
            block->_areaUsed = uVar10;
            block->_largestUnusedArea = block->_areaSize - uVar10;
            block->_searchStart = uVar10;
            block->_searchEnd = block->_areaSize;
            block->_flags = block->_flags & 0xfffffff9 | 2;
          }
          JitAllocatorImpl_insertBlock(impl,block);
          pJVar3[sVar14].emptyBlockCount = '\x01';
        }
LAB_001200c7:
        sVar14 = sVar14 + 1;
      } while (sVar14 != sVar2);
    }
  }
  return;
code_r0x0011ff7f:
  uVar11 = uVar15;
  if (uVar13 <= uVar15) goto code_r0x0011ff8b;
  goto LAB_0011ff5a;
code_r0x0011ff8b:
  uVar17 = 0;
LAB_0011ffd2:
  mem = (void *)(lVar7 * uVar9 + (long)pvVar6);
  byteSize = (uVar18 - lVar7) * uVar9;
  JitAllocatorImpl_fillPattern(mem,(impl->super_Impl).fillPattern,byteSize);
  VirtMem::flushInstructionCache(mem,byteSize);
  goto LAB_0011feed;
}

Assistant:

void JitAllocator::reset(ResetPolicy resetPolicy) noexcept {
  if (_impl == &JitAllocatorImpl_none)
    return;

  JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
  impl->tree.reset();
  size_t poolCount = impl->poolCount;

  for (size_t poolId = 0; poolId < poolCount; poolId++) {
    JitAllocatorPool& pool = impl->pools[poolId];
    JitAllocatorBlock* block = pool.blocks.first();

    pool.reset();

    if (block) {
      JitAllocatorBlock* blockToKeep = nullptr;
      if (resetPolicy != ResetPolicy::kHard && uint32_t(impl->options & JitAllocatorOptions::kImmediateRelease) == 0) {
        blockToKeep = block;
        block = block->next();
      }

      while (block) {
        JitAllocatorBlock* next = block->next();
        JitAllocatorImpl_deleteBlock(impl, block);
        block = next;
      }

      if (blockToKeep) {
        blockToKeep->_listNodes[0] = nullptr;
        blockToKeep->_listNodes[1] = nullptr;
        JitAllocatorImpl_wipeOutBlock(impl, blockToKeep);
        JitAllocatorImpl_insertBlock(impl, blockToKeep);
        pool.emptyBlockCount = 1;
      }
    }
  }
}